

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

bool __thiscall cfd::core::TapBranch::IsFindTapScript(TapBranch *this,Script *tapscript)

{
  TapBranch *pTVar1;
  bool bVar2;
  bool bVar3;
  TapBranch *this_00;
  
  if ((this->has_leaf_ == true) && (bVar2 = Script::Equals(&this->script_,tapscript), bVar2)) {
    return true;
  }
  this_00 = (this->branch_list_).
            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (this->branch_list_).
           super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar2 = this_00 != pTVar1;
  if (bVar2) {
    bVar3 = IsFindTapScript(this_00,tapscript);
    while (!bVar3) {
      this_00 = this_00 + 1;
      bVar2 = this_00 != pTVar1;
      if (this_00 == pTVar1) {
        return bVar2;
      }
      bVar3 = IsFindTapScript(this_00,tapscript);
    }
  }
  return bVar2;
}

Assistant:

bool TapBranch::IsFindTapScript(const Script& tapscript) const {
  if (has_leaf_ && script_.Equals(tapscript)) return true;

  for (const auto& branch : branch_list_) {
    if (branch.IsFindTapScript(tapscript)) return true;
  }
  return false;
}